

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdPrivkeyTweakMul(void *handle,char *privkey,char *tweak,char **output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  CfdException *pCVar4;
  KeyApi api;
  Privkey key;
  ByteData256 tweak_data;
  KeyApi local_a9;
  undefined1 local_a8 [32];
  string local_88;
  Privkey local_68;
  ByteData256 local_48;
  
  cfd::Initialize();
  if (output == (char **)0x0) {
    local_a8._0_8_ = "cfdcapi_key.cpp";
    local_a8._8_4_ = 0x637;
    local_a8._16_8_ = "CfdPrivkeyTweakMul";
    cfd::core::logger::log<>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"output is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Failed to parameter. output is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_a8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(privkey);
  if (!bVar2) {
    bVar2 = cfd::capi::IsEmptyString(tweak);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_88,privkey,(allocator *)&local_68);
      cfd::api::KeyApi::GetPrivkey
                ((Privkey *)local_a8,&local_a9,&local_88,(NetType *)0x0,(bool *)0x0);
      paVar1 = &local_88.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      std::__cxx11::string::string((string *)&local_88,tweak,(allocator *)&local_68);
      cfd::core::ByteData256::ByteData256(&local_48,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      cfd::core::Privkey::CreateTweakMul(&local_68,(Privkey *)local_a8,&local_48);
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_88,&local_68);
      pcVar3 = cfd::capi::CreateString(&local_88);
      *output = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((pointer)local_a8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._0_8_);
      }
      return 0;
    }
    local_a8._0_8_ = "cfdcapi_key.cpp";
    local_a8._8_4_ = 0x643;
    local_a8._16_8_ = "CfdPrivkeyTweakMul";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"tweak is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Failed to parameter. tweak is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_a8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a8._0_8_ = "cfdcapi_key.cpp";
  local_a8._8_4_ = 0x63d;
  local_a8._16_8_ = "CfdPrivkeyTweakMul";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"privkey is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"Failed to parameter. privkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_a8);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdPrivkeyTweakMul(
    void* handle, const char* privkey, const char* tweak, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    KeyApi api;
    Privkey key = api.GetPrivkey(std::string(privkey), nullptr, nullptr);
    ByteData256 tweak_data(tweak);
    *output = CreateString(key.CreateTweakMul(tweak_data).GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}